

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

UDate __thiscall
icu_63::CalendarAstronomer::riseOrSet
          (CalendarAstronomer *this,CoordFunc *func,UBool rise,double diameter,double refraction,
          double epsilon)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double local_58;
  double dStack_50;
  double local_40;
  double local_38;
  double local_30;
  
  local_58 = 0.0;
  dStack_50 = 0.0;
  local_40 = refraction;
  local_38 = diameter;
  local_30 = epsilon;
  dVar1 = tan(this->fLatitude);
  iVar5 = 5;
  do {
    (**func->_vptr_CoordFunc)(func,&local_58,this);
    dVar6 = tan(dStack_50);
    dVar6 = acos(dVar6 * -dVar1);
    if (rise != '\0') {
      dVar6 = 6.283185307179586 - dVar6;
    }
    dVar2 = lstToUT(this,((dVar6 + local_58) * 24.0) / 6.283185307179586);
    dVar6 = this->fTime;
    this->fTime = dVar2;
    clearCache(this);
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) break;
    dVar6 = uprv_fabs_63(dVar2 - dVar6);
  } while (local_30 < dVar6);
  dVar1 = cos(dStack_50);
  dVar6 = sin(this->fLatitude);
  dVar6 = acos(dVar6 / dVar1);
  dVar2 = sin(local_38 * 0.5 + local_40);
  dVar6 = sin(dVar6);
  dVar6 = asin(dVar2 / dVar6);
  lVar3 = (long)(((dVar6 * 240.0 * 57.29577951308232) / dVar1) * 1000.0);
  lVar4 = -lVar3;
  if (rise == '\0') {
    lVar4 = lVar3;
  }
  return (double)lVar4 + this->fTime;
}

Assistant:

UDate CalendarAstronomer::riseOrSet(CoordFunc& func, UBool rise,
                                    double diameter, double refraction,
                                    double epsilon)
{
    Equatorial pos;
    double      tanL   = ::tan(fLatitude);
    double     deltaT = 0;
    int32_t         count = 0;

    //
    // Calculate the object's position at the current time, then use that
    // position to calculate the time of rising or setting.  The position
    // will be different at that time, so iterate until the error is allowable.
    //
    U_DEBUG_ASTRO_MSG(("setup rise=%s, dia=%.3lf, ref=%.3lf, eps=%.3lf\n",
        rise?"T":"F", diameter, refraction, epsilon));
    do {
        // See "Practical Astronomy With Your Calculator, section 33.
        func.eval(pos, *this);
        double angle = ::acos(-tanL * ::tan(pos.declination));
        double lst = ((rise ? CalendarAstronomer_PI2-angle : angle) + pos.ascension ) * 24 / CalendarAstronomer_PI2;

        // Convert from LST to Universal Time.
        UDate newTime = lstToUT( lst );

        deltaT = newTime - fTime;
        setTime(newTime);
        U_DEBUG_ASTRO_MSG(("%d] dT=%.3lf, angle=%.3lf, lst=%.3lf,   A=%.3lf/D=%.3lf\n",
            count, deltaT, angle, lst, pos.ascension, pos.declination));
    }
    while (++ count < 5 && uprv_fabs(deltaT) > epsilon);

    // Calculate the correction due to refraction and the object's angular diameter
    double cosD  = ::cos(pos.declination);
    double psi   = ::acos(sin(fLatitude) / cosD);
    double x     = diameter / 2 + refraction;
    double y     = ::asin(sin(x) / ::sin(psi));
    long  delta  = (long)((240 * y * RAD_DEG / cosD)*SECOND_MS);

    return fTime + (rise ? -delta : delta);
}